

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::anon_unknown_1::generateTessEvaluationShader
                   (string *__return_storage_ptr__,ShaderType shaderType,
                   string *shaderUniformDeclarations,string *shaderBody)

{
  ostream *poVar1;
  allocator<char> local_1b9;
  ostringstream local_1b8 [8];
  ostringstream tessEvaluationShaderSource;
  allocator<char> local_29;
  string *local_28;
  string *shaderBody_local;
  string *shaderUniformDeclarations_local;
  string *psStack_10;
  ShaderType shaderType_local;
  
  local_28 = shaderBody;
  shaderBody_local = shaderUniformDeclarations;
  shaderUniformDeclarations_local._4_4_ = shaderType;
  psStack_10 = __return_storage_ptr__;
  if (shaderType < SHADERTYPE_TESS_EVALUATION) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\nlayout (triangles) in;\n\nvoid main (void)\n{\n\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n}\n"
               ,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else if (shaderType - SHADERTYPE_TESS_EVALUATION < 2) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar1 = std::operator<<((ostream *)local_1b8,"#version 310 es\n");
    poVar1 = std::operator<<(poVar1,"#extension GL_EXT_tessellation_shader : require\n");
    poVar1 = std::operator<<(poVar1,"layout (triangles) in;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"uniform highp int u_arrayNdx;\n\n");
    poVar1 = std::operator<<(poVar1,(string *)shaderBody_local);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"out mediump vec4 v_color;\n");
    poVar1 = std::operator<<(poVar1,"void main (void)\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"\thighp vec4 color;\n\n");
    poVar1 = std::operator<<(poVar1,(string *)local_28);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"\tv_color = color;\n");
    poVar1 = std::operator<<(poVar1,
                             "\tgl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
                            );
    std::operator<<(poVar1,"}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_1b9);
    std::allocator<char>::~allocator(&local_1b9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateTessEvaluationShader (ShaderType shaderType, const std::string& shaderUniformDeclarations, const std::string& shaderBody)
{
	static const char* const s_simpleTessEvaluationShaderSource =	"#version 310 es\n"
																	"#extension GL_EXT_tessellation_shader : require\n"
																	"layout (triangles) in;\n"
																	"\n"
																	"void main (void)\n"
																	"{\n"
																	"	gl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
																	"}\n";

	switch (shaderType)
	{
		case SHADERTYPE_VERTEX:
		case SHADERTYPE_FRAGMENT:
		case SHADERTYPE_TESS_CONTROL:
			return s_simpleTessEvaluationShaderSource;

		case SHADERTYPE_TESS_EVALUATION:
		case SHADERTYPE_ALL:
		{
			std::ostringstream tessEvaluationShaderSource;
			tessEvaluationShaderSource	<< "#version 310 es\n"
										<< "#extension GL_EXT_tessellation_shader : require\n"
										<< "layout (triangles) in;\n"
										<< "\n"
										<< "uniform highp int u_arrayNdx;\n\n"
										<< shaderUniformDeclarations << "\n"
										<< "out mediump vec4 v_color;\n"
										<< "void main (void)\n"
										<< "{\n"
										<< "	highp vec4 color;\n\n"
										<<	shaderBody << "\n"
										<< "	v_color = color;\n"
										<< "	gl_Position = gl_TessCoord[0] * gl_in[0].gl_Position + gl_TessCoord[1] * gl_in[1].gl_Position + gl_TessCoord[2] * gl_in[2].gl_Position;\n"
										<< "}\n";

			return tessEvaluationShaderSource.str();
		}

		default:
			DE_ASSERT(false);
			return "";
	}
}